

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2c-test.cpp
# Opt level: O1

void __thiscall CommandOptions::CommandOptions(CommandOptions *this,int argc,char **argv)

{
  size_t *psVar1;
  byte bVar2;
  int iVar3;
  _List_node_base *p_Var4;
  char *pcVar5;
  char *pcVar6;
  uint uVar7;
  FILE *this_00;
  bool bVar8;
  allocator<char> local_71;
  _List_node_base *local_70;
  FILE *local_68;
  _List_node_base *local_60;
  undefined1 local_58;
  undefined7 uStack_57;
  _List_node_base *p_Stack_50;
  char *local_48;
  char *local_40;
  char **local_38;
  
  this->error_flag = true;
  local_70 = (_List_node_base *)&this->filename_list;
  this->version_flag = false;
  this->verbose_flag = false;
  this->detail_flag = false;
  this->help_flag = false;
  (this->filename_list).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = local_70;
  (this->filename_list).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = local_70;
  (this->filename_list).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  bVar8 = 1 < argc;
  this_00 = (FILE *)this;
  local_38 = argv;
  if (1 < argc) {
    local_40 = (char *)(ulong)(uint)argc;
    local_48 = (char *)(1 - (long)local_40);
    pcVar6 = (char *)0x2;
    do {
      pcVar5 = local_38[(long)(pcVar6 + -1)];
      if (*pcVar5 == '-') {
        bVar2 = pcVar5[1];
        uVar7 = (uint)(char)bVar2;
        this_00 = (FILE *)(ulong)uVar7;
        iVar3 = isalpha(uVar7);
        if ((iVar3 == 0) || (pcVar5[2] != '\0')) goto LAB_00104d52;
        if (bVar2 < 0x72) {
          if (bVar2 == 0x56) {
            this->version_flag = true;
          }
          else {
            if (bVar2 != 0x68) {
LAB_00104e3a:
              this_00 = _stderr;
              fprintf(_stderr,"Unrecognized option: %c\n",(ulong)uVar7);
              if (bVar8) {
                return;
              }
              break;
            }
            this->help_flag = true;
          }
        }
        else if (bVar2 == 0x72) {
          this->detail_flag = true;
        }
        else {
          if (bVar2 != 0x76) goto LAB_00104e3a;
          this->verbose_flag = true;
        }
      }
      else {
LAB_00104d52:
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,pcVar5,&local_71);
        p_Var4 = (_List_node_base *)operator_new(0x30);
        p_Var4[1]._M_next = p_Var4 + 2;
        if (local_68 == (FILE *)&stack0xffffffffffffffa8) {
          p_Var4[2]._M_next = (_List_node_base *)CONCAT71(uStack_57,local_58);
          p_Var4[2]._M_prev = p_Stack_50;
        }
        else {
          p_Var4[1]._M_next = (_List_node_base *)local_68;
          p_Var4[2]._M_next = (_List_node_base *)CONCAT71(uStack_57,local_58);
        }
        p_Var4[1]._M_prev = local_60;
        local_60 = (_List_node_base *)0x0;
        local_58 = 0;
        local_68 = (FILE *)&stack0xffffffffffffffa8;
        std::__detail::_List_node_base::_M_hook(p_Var4);
        psVar1 = &(this->filename_list).
                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        this_00 = local_68;
        if (local_68 != (FILE *)&stack0xffffffffffffffa8) {
          operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
        }
      }
      bVar8 = pcVar6 < local_40;
      pcVar5 = local_48 + (long)pcVar6;
      pcVar6 = pcVar6 + 1;
    } while (pcVar5 != (char *)0x1);
  }
  if ((((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&local_70->_M_next)->_M_impl)._M_node.super__List_node_base._M_next == local_70) {
    CommandOptions((CommandOptions *)this_00);
  }
  else {
    this->error_flag = false;
  }
  return;
}

Assistant:

CommandOptions(int argc, const char** argv) :
    error_flag(true), version_flag(false), verbose_flag(false),
    detail_flag(false), help_flag(false)
  {
    for ( int i = 1; i < argc; i++ )
      {
	if ( argv[i][0] == '-' && isalpha(argv[i][1]) && argv[i][2] == 0 )
	  {
	    switch ( argv[i][1] )
	      {
	      case 'V': version_flag = true; break;
	      case 'h': help_flag = true; break;
	      case 'r': detail_flag = true; break;
	      case 'v': verbose_flag = true; break;

	      default:
		fprintf(stderr, "Unrecognized option: %c\n", argv[i][1]);
		return;
	      }
	  }
	else
	  {
	    filename_list.push_back(argv[i]);
	  }
      }

    if ( filename_list.empty() )
      {
	fputs("Input j2c filename(s) required.\n", stderr);
	return;
      }

    error_flag = false;
  }